

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O2

void wallet::group_outputs_tests::addCoin
               (CoinsResult *coins,CWallet *wallet,CTxDestination *dest,CAmount *nValue,
               bool is_from_me,CFeeRate fee_rate,int depth)

{
  OutputType type;
  long lVar1;
  long lVar2;
  optional<CFeeRate> feerate;
  int input_bytes;
  _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> _Var3;
  const_reference txout;
  optional<OutputType> *poVar4;
  int64_t time;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar5;
  char local_189;
  CMutableTransaction tx;
  undefined7 uStack_147;
  _Optional_payload_base<OutputType> local_140;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  undefined1 local_128 [48];
  COutput local_f8;
  uint256 txid;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx);
  tx.nLockTime = nextLockTime;
  nextLockTime = nextLockTime + 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = *nValue;
  GetScriptForDestination((CScript *)&local_f8,dest);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  CMutableTransaction::GetHash((Txid *)&local_f8,&tx);
  txid.super_base_blob<256U>.m_data._M_elems._16_8_ =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  txid.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  txid.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._9_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._10_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._11_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._12_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._13_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._14_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_f8.fee.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._15_1_;
  txid.super_base_blob<256U>.m_data._M_elems._0_8_ =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  txid.super_base_blob<256U>.m_data._M_elems[8] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  txid.super_base_blob<256U>.m_data._M_elems[9] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._9_1_;
  txid.super_base_blob<256U>.m_data._M_elems[10] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._10_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._11_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._12_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._13_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._14_1_;
  txid.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._15_1_;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock5,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
             ,0x2c,false);
  local_140 = (_Optional_payload_base<OutputType>)&txid;
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)local_128);
  local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (long)&local_189;
  local_189 = '\0';
  local_f8.effective_value.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ = (CMutableTransaction *)local_128;
  pVar5 = std::
          _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256_const&>,std::tuple<std::shared_ptr<CTransaction_const>&&,wallet::TxStateInactive&&>>
                    ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&wallet->mapWallet,&std::piecewise_construct,&local_140);
  _Var3 = pVar5.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
          _M_cur;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("ret.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                  ,0x2e,
                  "void wallet::group_outputs_tests::addCoin(CoinsResult &, CWallet &, const CTxDestination &, const CAmount &, bool, CFeeRate, int)"
                 );
  }
  txout = std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     (*(long *)((long)_Var3.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x18),0);
  local_140 = (_Optional_payload_base<OutputType>)OutputTypeFromDestination(dest);
  poVar4 = inline_assertion_check<true,std::optional<OutputType>>
                     ((optional<OutputType> *)&local_140,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                      ,0x31,"addCoin","OutputTypeFromDestination(dest)");
  type = (poVar4->super__Optional_base<OutputType,_true,_true>)._M_payload.
         super__Optional_payload_base<OutputType>._M_payload._M_value;
  lVar2 = *(long *)((long)_Var3.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1c0);
  local_128._0_8_ = *(undefined8 *)(lVar2 + 0x39);
  local_128._8_8_ = *(undefined8 *)(lVar2 + 0x41);
  local_128._16_8_ = *(undefined8 *)(lVar2 + 0x49);
  local_128._24_8_ = *(undefined8 *)(lVar2 + 0x51);
  local_128._32_4_ = 0;
  input_bytes = CalculateMaximumSignedInputSize(txout,wallet,(CCoinControl *)0x0);
  time = CWalletTx::GetTxTime
                   ((CWalletTx *)
                    ((long)_Var3.
                           super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                           ._M_cur + 0x28));
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._9_7_ = uStack_147;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
       (CFeeRate)(CFeeRate)fee_rate.nSatoshisPerK;
  COutput::COutput(&local_f8,(COutPoint *)local_128,txout,depth,input_bytes,true,true,true,time,
                   is_from_me,feerate);
  CoinsResult::Add(coins,type,&local_f8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)((long)&local_f8 + 0x50));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addCoin(CoinsResult& coins,
                     CWallet& wallet,
                     const CTxDestination& dest,
                     const CAmount& nValue,
                     bool is_from_me,
                     CFeeRate fee_rate = CFeeRate(0),
                     int depth = 6)
{
    CMutableTransaction tx;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    tx.vout.resize(1);
    tx.vout[0].nValue = nValue;
    tx.vout[0].scriptPubKey = GetScriptForDestination(dest);

    const auto txid{tx.GetHash().ToUint256()};
    LOCK(wallet.cs_wallet);
    auto ret = wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(txid), std::forward_as_tuple(MakeTransactionRef(std::move(tx)), TxStateInactive{}));
    assert(ret.second);
    CWalletTx& wtx = (*ret.first).second;
    const auto& txout = wtx.tx->vout.at(0);
    coins.Add(*Assert(OutputTypeFromDestination(dest)),
              {COutPoint(wtx.GetHash(), 0),
                   txout,
                   depth,
                   CalculateMaximumSignedInputSize(txout, &wallet, /*coin_control=*/nullptr),
                   /*spendable=*/ true,
                   /*solvable=*/ true,
                   /*safe=*/ true,
                   wtx.GetTxTime(),
                   is_from_me,
                   fee_rate});
}